

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

CPAccessResult access_tpm(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  _Bool _Var1;
  int iVar2;
  int el;
  _Bool isread_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  iVar2 = arm_current_el(env);
  if (((iVar2 < 2) && (((env->cp15).mdcr_el2 & 0x40) != 0)) &&
     (_Var1 = arm_is_secure_below_el3(env), !_Var1)) {
    return CP_ACCESS_TRAP_EL2;
  }
  if ((iVar2 < 3) && (((env->cp15).mdcr_el3 & 0x40) != 0)) {
    env_local._4_4_ = CP_ACCESS_TRAP_EL3;
  }
  else {
    env_local._4_4_ = CP_ACCESS_OK;
  }
  return env_local._4_4_;
}

Assistant:

static CPAccessResult access_tpm(CPUARMState *env, const ARMCPRegInfo *ri,
                                 bool isread)
{
    int el = arm_current_el(env);

    if (el < 2 && (env->cp15.mdcr_el2 & MDCR_TPM)
        && !arm_is_secure_below_el3(env)) {
        return CP_ACCESS_TRAP_EL2;
    }
    if (el < 3 && (env->cp15.mdcr_el3 & MDCR_TPM)) {
        return CP_ACCESS_TRAP_EL3;
    }
    return CP_ACCESS_OK;
}